

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflatmap_p.h
# Opt level: O2

pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool>
* __thiscall
QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
::try_emplace<QDBusListener::ChangeSignal>
          (pair<QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>::iterator,_bool>
           *__return_storage_ptr__,
          QFlatMap<QDBusListener::DBusKey,_QDBusListener::ChangeSignal,_std::less<QDBusListener::DBusKey>,_QList<QDBusListener::DBusKey>,_QList<QDBusListener::ChangeSignal>_>
          *this,DBusKey *key,ChangeSignal *args)

{
  mapped_container_type *this_00;
  size_type sVar1;
  bool bVar2;
  DBusKey *other;
  iterator iVar3;
  iterator iVar4;
  long lVar5;
  long in_FS_OFFSET;
  iterator iVar6;
  iterator local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = lower_bound(this,key);
  if ((local_48.c != &this->c) || (lVar5 = local_48.i, local_48.i != (this->c).keys.d.size)) {
    other = iterator::key(&local_48);
    bVar2 = QDBusListener::DBusKey::operator<(key,other);
    if (!bVar2) {
      *(undefined4 *)&(__return_storage_ptr__->first).c = local_48.c._0_4_;
      *(undefined4 *)((long)&(__return_storage_ptr__->first).c + 4) = local_48.c._4_4_;
      *(undefined4 *)&(__return_storage_ptr__->first).i = (undefined4)local_48.i;
      *(undefined4 *)((long)&(__return_storage_ptr__->first).i + 4) = local_48.i._4_4_;
      bVar2 = false;
      goto LAB_0059cb53;
    }
    lVar5 = local_48.i;
  }
  this_00 = &(this->c).values;
  iVar3 = QList<QDBusListener::ChangeSignal>::begin(this_00);
  QList<QDBusListener::ChangeSignal>::emplace<QDBusListener::ChangeSignal>
            (this_00,iVar3.i + lVar5,args);
  sVar1 = local_48.i;
  iVar4 = QList<QDBusListener::DBusKey>::begin((QList<QDBusListener::DBusKey> *)this);
  iVar4 = QList<QDBusListener::DBusKey>::insert
                    ((QList<QDBusListener::DBusKey> *)this,iVar4.i + sVar1,key);
  iVar6 = fromKeysIterator(this,iVar4);
  __return_storage_ptr__->first = iVar6;
  bVar2 = true;
LAB_0059cb53:
  __return_storage_ptr__->second = bVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::pair<iterator, bool> try_emplace(const Key &key, Args&&...args)
    {
        auto it = lower_bound(key);
        if (it == end() || key_compare::operator()(key, it.key())) {
            c.values.emplace(toValuesIterator(it), std::forward<Args>(args)...);
            return { fromKeysIterator(c.keys.insert(toKeysIterator(it), key)), true };
        } else {
            return {it, false};
        }
    }